

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

state * __thiscall parser::state::operator++(state *this)

{
  ind *piVar1;
  size_type sVar2;
  ssize_t sVar3;
  reference puVar4;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (this->pos).i - (this->off).i;
  sVar2 = std::deque<char,_std::allocator<char>_>::size(&this->str);
  if (sVar2 <= uVar6) {
    return this;
  }
  (this->pos).i = (this->pos).i + 1;
  sVar2 = std::deque<char,_std::allocator<char>_>::size(&this->str);
  if ((uVar6 + 1 != sVar2) || (sVar3 = read(this,in_ESI,__buf,in_RCX), (char)sVar3 != '\0')) {
    lVar5 = (this->pos).ln - (this->off).ln;
    sVar2 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->lines);
    if ((lVar5 != sVar2 - 1) &&
       (uVar6 = (this->pos).i,
       puVar4 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                          (&(this->lines).
                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                            .super__Deque_impl_data._M_start,lVar5 + 1), *puVar4 <= uVar6)) {
      piVar1 = &(this->pos).ln;
      *piVar1 = *piVar1 + 1;
      (this->pos).cl = 0;
      return this;
    }
  }
  piVar1 = &(this->pos).cl;
  *piVar1 = *piVar1 + 1;
  return this;
}

Assistant:

state& operator ++ () {
			ind i = pos.i - off.i;
			
			// ignore if already end of stream
			if ( i >= str.size() ) return *this;
			
			// update index
			++pos.i;
			
			// read more input if neccessary, terminating on end-of-stream
			if ( ++i == str.size() && !read() ) { ++pos.cl; return *this; }
			
			// update row and column
			ind j = pos.ln - off.ln;
			if ( j == lines.size() - 1 || pos.i < lines[j+1] ) {
				++pos.cl;
			} else {
				++pos.ln;
				pos.cl = 0;
			}
			
			return *this;
		}